

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckMemberFunctions.cxx
# Opt level: O3

string * __thiscall
kws::Parser::FindMemberFunction
          (string *__return_storage_ptr__,Parser *this,string *buffer,size_t start,size_t end,
          size_t *pos)

{
  byte __lhs;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ulong pos_00;
  long lVar4;
  size_t pos_01;
  ulong uVar5;
  bool bVar6;
  string functionLine;
  string line;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pos_00 = std::__cxx11::string::find((char *)buffer,0x175d46,start);
  if (pos_00 < end) {
    do {
      lVar4 = GetLineNumber(this,pos_00,true);
      GetLine_abi_cxx11_(&local_70,this,lVar4 - 1);
      lVar4 = std::__cxx11::string::find((char *)&local_70,0x176e4e,0);
      if ((lVar4 == -1) &&
         (lVar4 = std::__cxx11::string::find((char *)&local_70,0x176e5a,0), uVar5 = pos_00,
         lVar4 == -1)) {
        do {
          do {
            if (uVar5 == 0) {
              pos_01 = 0xffffffffffffffff;
              goto LAB_00159e24;
            }
            uVar5 = uVar5 - 1;
            pos_01 = uVar5;
            if (uVar5 < start) goto LAB_00159e24;
          } while ((buffer->_M_dataplus)._M_p[uVar5] != ')');
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
          pos_01 = FindClosingChar(this,')','(',uVar5,true,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        } while ((pos_01 == 0) ||
                (bVar2 = IsInFunction(this,pos_01,(buffer->_M_dataplus)._M_p), bVar2));
LAB_00159e24:
        uVar5 = pos_01 - 1;
        *pos = uVar5;
        if (end <= uVar5 || uVar5 <= start) goto LAB_0015a0bc;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        uVar5 = *pos;
        if (start < uVar5 && uVar5 != 0xffffffffffffffff) {
          bVar2 = false;
          do {
            __lhs = (buffer->_M_dataplus)._M_p[uVar5];
            if (((ulong)__lhs < 0x2b) && ((0x44100002600U >> ((ulong)__lhs & 0x3f) & 1) != 0)) {
              if (bVar2) break;
              bVar2 = false;
            }
            else {
              std::operator+(&local_b0,__lhs,__return_storage_ptr__);
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              bVar2 = true;
            }
            uVar5 = uVar5 - 1;
          } while (start < uVar5);
        }
        lVar4 = GetLineNumber(this,pos_01,true);
        GetLine_abi_cxx11_(&local_b0,this,lVar4 - 1);
        bVar2 = false;
        lVar4 = std::__cxx11::string::find((char *)&local_b0,0x1762aa,0);
        bVar6 = true;
        if (lVar4 == -1) {
          bVar2 = false;
          lVar4 = std::__cxx11::string::find((char *)&local_b0,0x176e4e,0);
          if (lVar4 == -1) {
            bVar2 = false;
            lVar4 = std::__cxx11::string::find((char *)&local_b0,0x176e5a,0);
            if (lVar4 == -1) {
              bVar2 = false;
              lVar4 = std::__cxx11::string::find((char *)&local_b0,0x176e64,0);
              if (lVar4 == -1) {
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x175d52,0);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_50);
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0]);
                  }
                }
                lVar4 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x176e43,0);
                if (lVar4 != -1) {
                  std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
                  std::__cxx11::string::operator=
                            ((string *)__return_storage_ptr__,(string *)local_50);
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0]);
                  }
                }
                iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
                bVar6 = iVar3 == 0;
                bVar2 = !bVar6;
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((!bVar2) &&
           (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar1 != &__return_storage_ptr__->field_2)) {
          operator_delete(pcVar1);
        }
        bVar2 = true;
        if (bVar6) goto LAB_0015a0bc;
      }
      else {
LAB_0015a0bc:
        bVar2 = false;
        pos_00 = std::__cxx11::string::find((char *)buffer,0x175d46,pos_00 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar2) {
        return __return_storage_ptr__;
      }
    } while (pos_00 < end);
  }
  *pos = 0xffffffffffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindMemberFunction(std::string & buffer, size_t start, size_t end,size_t& pos)
{
  size_t posSemicolon = buffer.find(";",start);
  while(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We check that we don't have the keyword __attribute__
    std::string line = this->GetLine(this->GetLineNumber(posSemicolon,true)-1);
    if((line.find("_attribute_") != std::string::npos)
      || (line.find(" operator") != std::string::npos)
      )
      {
      posSemicolon = buffer.find(";",posSemicolon+1);
      continue;
      }

    // We try to find a (
    size_t i=posSemicolon-1;
    bool inFunction = true;
    while(i != std::string::npos && i>=start && inFunction)
      {
      if(buffer[i] == ')')
        {
        size_t close = this->FindClosingChar(')','(',i,true);
        if(close>0 && !this->IsInFunction(close,buffer.c_str()))
          {
          i = close;
          inFunction = false;
          break;
          }
        }
      i--;
      }

    pos = i-1;

    // If we have a match we extract the word
    if(pos != std::string::npos && pos>start && pos<end)
      {
      std::string functionName = "";
      bool inWord = false;
      size_t index=pos;
      for(;index!=std::string::npos && index>start;index--)
        {
        if(buffer[index] != ' ' && buffer[index] != '\t'
           && buffer[index] != '\r' && buffer[index] != '\n' && buffer[index] != '*' && buffer[index] != '&')
          {
          inWord = true;
          functionName = buffer[index]+functionName;
          }
        else if(inWord)
          {
          break;
          }
        }
      // Check that this is not a #define (tricky)
      std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);
      if(functionLine.find("#define") == std::string::npos
         && functionLine.find("_attribute_") == std::string::npos
         && functionLine.find(" operator") == std::string::npos
         && functionLine.find("friend ") == std::string::npos)
        {
        // If we have a class definition: Test():Base
        // we return the correct
        size_t posf = functionName.find("(",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }
        posf = functionName.find(":",0);
        if(posf != std::string::npos)
          {
          functionName = functionName.substr(0,posf);
          }

        // If the function name is void we skip because it means
        // this is a member variable function (see bug 5086)
        if(functionName != "void")
          {
          return functionName;
          }
        }
      }
    posSemicolon = buffer.find(";",posSemicolon+1);
    }

  pos = std::string::npos;
  return "";
}